

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_begin_titled(nk_context *ctx,char *name,char *title,nk_rect bounds,nk_flags flags)

{
  nk_rect rect;
  nk_hash nVar1;
  int iVar2;
  nk_context *length;
  nk_panel *pnVar3;
  uint in_ECX;
  long in_RDX;
  char *in_RSI;
  nk_context *in_RDI;
  undefined4 in_XMM0_Da;
  float fVar4;
  undefined4 in_XMM0_Db;
  undefined8 in_XMM1_Qa;
  undefined8 uVar5;
  nk_rect nVar6;
  nk_rect iter_bounds_1;
  nk_rect iter_bounds;
  nk_rect win_bounds;
  float h;
  nk_window *iter;
  int ishovered;
  int inpanel;
  nk_size name_length;
  int ret;
  int title_len;
  nk_hash title_hash;
  nk_style *style;
  nk_window *win;
  nk_panel_type in_stack_0000015c;
  char *in_stack_00000160;
  nk_context *in_stack_00000168;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  bool bVar7;
  nk_context *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 uVar8;
  float fVar9;
  float local_c0;
  nk_context *in_stack_ffffffffffffff48;
  undefined8 uVar10;
  undefined8 in_stack_ffffffffffffff50;
  nk_input *in_stack_ffffffffffffff58;
  nk_hash in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  void *in_stack_ffffffffffffff68;
  float fVar11;
  float fStack_8c;
  undefined8 local_84;
  undefined8 uStack_7c;
  nk_window *local_70;
  nk_window *local_40;
  int local_4;
  
  if ((((in_RDI == (nk_context *)0x0) || (in_RDI->current != (nk_window *)0x0)) || (in_RDX == 0)) ||
     (in_RSI == (char *)0x0)) {
    local_4 = 0;
  }
  else {
    nk_strlen(in_RSI);
    nVar1 = nk_murmur_hash(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                           in_stack_ffffffffffffff60);
    stack0xffffffffffffff44 = (float)((ulong)_local_c0 >> 0x20);
    local_40 = nk_find_window(in_stack_ffffffffffffff48,(nk_hash)stack0xffffffffffffff44,
                              in_stack_ffffffffffffff38);
    if (local_40 == (nk_window *)0x0) {
      iVar2 = nk_strlen(in_RSI);
      length = (nk_context *)(long)iVar2;
      local_40 = (nk_window *)
                 nk_create_window((nk_context *)
                                  CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      if (local_40 == (nk_window *)0x0) {
        return 0;
      }
      if ((in_ECX & 0x100) == 0) {
        nk_insert_window(in_RDI,local_40,NK_INSERT_BACK);
      }
      else {
        nk_insert_window(in_RDI,local_40,NK_INSERT_FRONT);
      }
      nk_command_buffer_init(&local_40->buffer,&in_RDI->memory,NK_CLIPPING_ON);
      local_40->flags = in_ECX;
      (local_40->bounds).x = (float)in_XMM0_Da;
      (local_40->bounds).y = (float)in_XMM0_Db;
      (local_40->bounds).w = (float)(int)in_XMM1_Qa;
      (local_40->bounds).h = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
      local_40->name = nVar1;
      if ((nk_context *)0x3e < length) {
        length = (nk_context *)0x3f;
      }
      in_stack_ffffffffffffff30 = length;
      nk_memcopy(local_40->name_string,in_RSI,(nk_size)length);
      local_40->name_string[(long)length] = '\0';
      (local_40->popup).win = (nk_window *)0x0;
      if (in_RDI->active == (nk_window *)0x0) {
        in_RDI->active = local_40;
      }
    }
    else {
      local_40->flags = local_40->flags & 0xfffffc00;
      local_40->flags = in_ECX | local_40->flags;
      local_40->seq = in_RDI->seq;
      if (in_RDI->active == (nk_window *)0x0) {
        in_RDI->active = local_40;
      }
    }
    if ((local_40->flags & 0x1000) == 0) {
      if ((local_40->flags & 0x1000) == 0) {
        local_70 = local_40;
        unique0x00006b00 = (in_RDI->style).window.header.padding.y;
        fVar4 = (in_RDI->style).window.header.label_padding.y;
        fVar4 = fVar4 + fVar4 + unique0x00006b00 + unique0x00006b00 + ((in_RDI->style).font)->height
        ;
        if ((local_40->flags & 0x4000) == 0) {
          local_84._0_4_ = (local_40->bounds).x;
          local_84._4_4_ = (local_40->bounds).y;
          uStack_7c._0_4_ = (local_40->bounds).w;
          uStack_7c._4_4_ = (local_40->bounds).h;
        }
        else {
          nVar6 = nk_rect((local_40->bounds).x,(local_40->bounds).y,(local_40->bounds).w,fVar4);
          uStack_7c = nVar6._8_8_;
          local_84 = nVar6._0_8_;
        }
        nk_start(in_stack_ffffffffffffff30,
                 (nk_window *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        fVar11 = (float)uStack_7c;
        fStack_8c = (float)((ulong)uStack_7c >> 0x20);
        nVar6.y = (float)local_84;
        nVar6.w = local_84._4_4_;
        nVar6.x = (float)in_stack_ffffffffffffff64;
        nVar6.h = fVar11;
        iVar2 = nk_input_has_mouse_click_down_in_rect
                          (in_stack_ffffffffffffff58,
                           (nk_buttons)((ulong)in_stack_ffffffffffffff50 >> 0x20),nVar6,
                           (int)in_stack_ffffffffffffff50);
        bVar7 = false;
        if (iVar2 != 0) {
          bVar7 = (in_RDI->input).mouse.buttons[0].clicked != 0;
        }
        rect.w = fVar11;
        rect.x = (float)local_84;
        rect.y = local_84._4_4_;
        rect.h = fStack_8c;
        in_stack_ffffffffffffff2f = bVar7;
        iVar2 = nk_input_is_mouse_hovering_rect(&in_RDI->input,rect);
        if (((local_40 != in_RDI->active) && (iVar2 != 0)) &&
           ((in_RDI->input).mouse.buttons[0].down == 0)) {
          for (local_70 = local_40->next; local_70 != (nk_window *)0x0; local_70 = local_70->next) {
            if ((local_70->flags & 0x4000) == 0) {
              uVar10._0_4_ = (local_70->bounds).x;
              uVar10._4_4_ = (local_70->bounds).y;
              uVar5._0_4_ = (local_70->bounds).w;
              uVar5._4_4_ = (local_70->bounds).h;
            }
            else {
              nVar6 = nk_rect((local_70->bounds).x,(local_70->bounds).y,(local_70->bounds).w,fVar4);
              uVar5 = nVar6._8_8_;
              uVar10 = nVar6._0_8_;
            }
            if (((((float)uVar10 <= (float)local_84 + fVar11) &&
                 ((float)local_84 <= (float)uVar10 + (float)uVar5)) &&
                (((stack0xffffffffffffff4c = (float)((ulong)uVar10 >> 0x20),
                  stack0xffffffffffffff4c <= local_84._4_4_ + fStack_8c &&
                  (local_84._4_4_ <= stack0xffffffffffffff4c + (float)((ulong)uVar5 >> 0x20))) &&
                 (((local_70->flags & 0x1000) == 0 || ((local_70->flags & 0x100) == 0)))))) ||
               (((local_70->popup).win != (nk_window *)0x0 &&
                (((((local_70->popup).active != 0 && ((local_70->flags & 0x1000) == 0)) &&
                  ((((local_70->popup).win)->bounds).x <= (local_40->bounds).x + fVar11)) &&
                 ((((local_40->bounds).x <=
                    (((local_70->popup).win)->bounds).x + (((local_70->popup).win)->bounds).w &&
                   ((((local_70->popup).win)->bounds).y <= local_84._4_4_ + fStack_8c)) &&
                  (local_84._4_4_ <=
                   (((local_70->popup).win)->bounds).y + (((local_70->popup).win)->bounds).h))))))))
            break;
          }
        }
        if (((local_70 != (nk_window *)0x0) && (bVar7 != false)) &&
           ((local_40 != in_RDI->end && ((local_70->flags & 0x100) == 0)))) {
          for (local_70 = local_40->next; local_70 != (nk_window *)0x0; local_70 = local_70->next) {
            if ((local_70->flags & 0x4000) == 0) {
              uVar8._0_4_ = (local_70->bounds).x;
              uVar8._4_4_ = (local_70->bounds).y;
              local_c0 = (local_70->bounds).w;
              unique0x00012004 = (local_70->bounds).h;
            }
            else {
              nVar6 = nk_rect((local_70->bounds).x,(local_70->bounds).y,(local_70->bounds).w,fVar4);
              _local_c0 = nVar6._8_8_;
              uVar8 = nVar6._0_8_;
            }
            if ((((((float)uVar8 <= (in_RDI->input).mouse.pos.x) &&
                  ((in_RDI->input).mouse.pos.x <= (float)uVar8 + local_c0)) &&
                 (fVar9 = (float)((ulong)uVar8 >> 0x20), fVar9 <= (in_RDI->input).mouse.pos.y)) &&
                ((stack0xffffffffffffff44 = (float)((ulong)_local_c0 >> 0x20),
                 (in_RDI->input).mouse.pos.y <= fVar9 + stack0xffffffffffffff44 &&
                 ((local_70->flags & 0x1000) == 0)))) ||
               ((((local_70->popup).win != (nk_window *)0x0 &&
                 (((local_70->popup).active != 0 && ((local_70->flags & 0x1000) == 0)))) &&
                (((((local_70->popup).win)->bounds).x <= (float)local_84 + fVar11 &&
                 ((((float)local_84 <=
                    (((local_70->popup).win)->bounds).x + (((local_70->popup).win)->bounds).w &&
                   ((((local_70->popup).win)->bounds).y <= local_84._4_4_ + fStack_8c)) &&
                  (local_84._4_4_ <=
                   (((local_70->popup).win)->bounds).y + (((local_70->popup).win)->bounds).h))))))))
            break;
          }
        }
        if ((local_70 == (nk_window *)0x0) && (in_RDI->end != local_40)) {
          if ((local_40->flags & 0x100) == 0) {
            nk_remove_window(in_RDI,local_40);
            nk_insert_window(in_RDI,local_40,NK_INSERT_BACK);
          }
          local_40->flags = local_40->flags & 0xfffff7ff;
          in_RDI->active = local_40;
        }
        if ((in_RDI->end != local_40) && ((local_40->flags & 0x100) == 0)) {
          local_40->flags = local_40->flags | 0x800;
        }
      }
      pnVar3 = (nk_panel *)
               nk_create_panel((nk_context *)
                               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      local_40->layout = pnVar3;
      in_RDI->current = local_40;
      local_4 = nk_panel_begin(in_stack_00000168,in_stack_00000160,in_stack_0000015c);
      local_40->layout->offset = &local_40->scrollbar;
    }
    else {
      in_RDI->current = local_40;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

NK_API int
nk_begin_titled(struct nk_context *ctx, const char *name, const char *title,
    struct nk_rect bounds, nk_flags flags)
{
    struct nk_window *win;
    struct nk_style *style;
    nk_hash title_hash;
    int title_len;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(title);
    NK_ASSERT(ctx->style.font && ctx->style.font->width && "if this triggers you forgot to add a font");
    NK_ASSERT(!ctx->current && "if this triggers you missed a `nk_end` call");
    if (!ctx || ctx->current || !title || !name)
        return 0;

    /* find or create window */
    style = &ctx->style;
    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) {
        /* create new window */
        nk_size name_length = (nk_size)nk_strlen(name);
        win = (struct nk_window*)nk_create_window(ctx);
        NK_ASSERT(win);
        if (!win) return 0;

        if (flags & NK_WINDOW_BACKGROUND)
            nk_insert_window(ctx, win, NK_INSERT_FRONT);
        else nk_insert_window(ctx, win, NK_INSERT_BACK);
        nk_command_buffer_init(&win->buffer, &ctx->memory, NK_CLIPPING_ON);

        win->flags = flags;
        win->bounds = bounds;
        win->name = title_hash;
        name_length = NK_MIN(name_length, NK_WINDOW_MAX_NAME-1);
        NK_MEMCPY(win->name_string, name, name_length);
        win->name_string[name_length] = 0;
        win->popup.win = 0;
        if (!ctx->active)
            ctx->active = win;
    } else {
        /* update window */
        win->flags &= ~(nk_flags)(NK_WINDOW_PRIVATE-1);
        win->flags |= flags;
        NK_ASSERT(win->seq != ctx->seq && "if this triggers you probably have two windows with same name!");
        win->seq = ctx->seq;
        if (!ctx->active)
            ctx->active = win;
    }
    if (win->flags & NK_WINDOW_HIDDEN) {
        ctx->current = win;
        return 0;
    }

    /* window overlapping */
    if (!(win->flags & NK_WINDOW_HIDDEN))
    {
        int inpanel, ishovered;
        const struct nk_window *iter = win;
        float h = ctx->style.font->height + 2.0f * style->window.header.padding.y +
            (2.0f * style->window.header.label_padding.y);
        struct nk_rect win_bounds = (!(win->flags & NK_WINDOW_MINIMIZED))?
            win->bounds: nk_rect(win->bounds.x, win->bounds.y, win->bounds.w, h);

        /* activate window if hovered and no other window is overlapping this window */
        nk_start(ctx, win);
        inpanel = nk_input_has_mouse_click_down_in_rect(&ctx->input, NK_BUTTON_LEFT, win_bounds, nk_true);
        inpanel = inpanel && ctx->input.mouse.buttons[NK_BUTTON_LEFT].clicked;
        ishovered = nk_input_is_mouse_hovering_rect(&ctx->input, win_bounds);
        if ((win != ctx->active) && ishovered && !ctx->input.mouse.buttons[NK_BUTTON_LEFT].down) {
            iter = win->next;
            while (iter) {
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                    iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    (!(iter->flags & NK_WINDOW_HIDDEN) || !(iter->flags & NK_WINDOW_BACKGROUND)))
                    break;

                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win->bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        /* activate window if clicked */
        if (iter && inpanel && (win != ctx->end) && !(iter->flags & NK_WINDOW_BACKGROUND)) {
            iter = win->next;
            while (iter) {
                /* try to find a panel with higher priority in the same position */
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INBOX(ctx->input.mouse.pos.x, ctx->input.mouse.pos.y,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    !(iter->flags & NK_WINDOW_HIDDEN))
                    break;
                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        if (!iter && ctx->end != win) {
            if (!(win->flags & NK_WINDOW_BACKGROUND)) {
                /* current window is active in that position so transfer to top
                 * at the highest priority in stack */
                nk_remove_window(ctx, win);
                nk_insert_window(ctx, win, NK_INSERT_BACK);
            }
            win->flags &= ~(nk_flags)NK_WINDOW_ROM;
            ctx->active = win;
        }
        if (ctx->end != win && !(win->flags & NK_WINDOW_BACKGROUND))
            win->flags |= NK_WINDOW_ROM;
    }

    win->layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = win;
    ret = nk_panel_begin(ctx, title, NK_PANEL_WINDOW);
    win->layout->offset = &win->scrollbar;
    return ret;
}